

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_EvNormalPartials(ON_3dVector *ds,ON_3dVector *dt,ON_3dVector *dss,ON_3dVector *dst,
                        ON_3dVector *dtt,ON_3dVector *ns,ON_3dVector *nt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  double dVar11;
  ON_3dVector V;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  dVar7 = ON_3dVector::operator*(ds,ds);
  dVar8 = ON_3dVector::operator*(ds,dt);
  dVar9 = ON_3dVector::operator*(dt,dt);
  bVar10 = ON_EvJacobian(dVar7,dVar8,dVar9,(double *)0x0);
  if (bVar10) {
    ON_CrossProduct(&local_48,ds,dt);
    dVar7 = ON_3dVector::Length(&local_48);
    if (2.220446049250313e-16 <= dVar7) {
      dVar11 = dVar7 * dVar7 * dVar7;
      dVar8 = dt->z;
      dVar9 = dss->z;
      dVar1 = dst->z;
      dVar2 = ds->z;
      ns->x = (ds->y * dVar1 + (dss->y * dVar8 - dt->y * dVar9)) - dst->y * dVar2;
      dVar3 = dt->x;
      dVar4 = dss->x;
      dVar5 = dst->x;
      dVar6 = ds->x;
      ns->y = (dVar2 * dVar5 + (dVar9 * dVar3 - dVar8 * dVar4)) - dVar1 * dVar6;
      dVar8 = dt->y;
      dVar9 = dst->y;
      dVar1 = ds->y;
      ns->z = (dVar6 * dVar9 + (dVar4 * dVar8 - dVar3 * dss->y)) - dVar5 * dVar1;
      dVar2 = dt->z;
      dVar3 = dst->z;
      dVar4 = dtt->z;
      dVar5 = ds->z;
      nt->x = (dVar1 * dVar4 + (dVar9 * dVar2 - dVar8 * dVar3)) - dtt->y * dVar5;
      dVar8 = dt->x;
      dVar9 = dst->x;
      dVar1 = dtt->x;
      dVar6 = ds->x;
      nt->y = (dVar5 * dVar1 + (dVar3 * dVar8 - dVar2 * dVar9)) - dVar4 * dVar6;
      nt->z = (dVar6 * dtt->y + (dVar9 * dt->y - dVar8 * dst->y)) - dVar1 * ds->y;
      ON_3dVector::operator/(&local_78,ns,dVar7);
      dVar8 = ON_3dVector::operator*(&local_48,ns);
      operator*(&local_90,dVar8 / dVar11,&local_48);
      ON_3dVector::operator-(&local_60,&local_78,&local_90);
      ns->z = local_60.z;
      ns->x = local_60.x;
      ns->y = local_60.y;
      ON_3dVector::operator/(&local_78,nt,dVar7);
      dVar7 = ON_3dVector::operator*(&local_48,nt);
      operator*(&local_90,dVar7 / dVar11,&local_48);
      ON_3dVector::operator-(&local_60,&local_78,&local_90);
      nt->z = local_60.z;
      nt->x = local_60.x;
      nt->y = local_60.y;
      return true;
    }
    ns->z = ON_3dVector::ZeroVector.z;
    dVar7 = ON_3dVector::ZeroVector.y;
    ns->x = ON_3dVector::ZeroVector.x;
    ns->y = dVar7;
    nt->z = ON_3dVector::ZeroVector.z;
    dVar7 = ON_3dVector::ZeroVector.y;
    nt->x = ON_3dVector::ZeroVector.x;
    nt->y = dVar7;
  }
  else {
    ns->z = ON_3dVector::ZeroVector.z;
    dVar7 = ON_3dVector::ZeroVector.y;
    ns->x = ON_3dVector::ZeroVector.x;
    ns->y = dVar7;
    nt->z = ON_3dVector::ZeroVector.z;
    dVar7 = ON_3dVector::ZeroVector.y;
    nt->x = ON_3dVector::ZeroVector.x;
    nt->y = dVar7;
  }
  return false;
}

Assistant:

bool 
ON_EvNormalPartials(
        const ON_3dVector& ds,
        const ON_3dVector& dt,
        const ON_3dVector& dss,
        const ON_3dVector& dst,
        const ON_3dVector& dtt,
        ON_3dVector& ns,
        ON_3dVector& nt
        )
{
  bool rc = false;
  const double ds_o_ds = ds*ds;
  const double ds_o_dt = ds*dt;
  const double dt_o_dt = dt*dt;

  rc = ON_EvJacobian( ds_o_ds, ds_o_dt, dt_o_dt, nullptr );
  if (!rc) 
  {
    // degenerate Jacobian and unit surface normal is not well defined
    ns = ON_3dVector::ZeroVector;
    nt = ON_3dVector::ZeroVector;
  }
  else 
  {
    // If V: . -> R^3 is nonzero and C^2 and N = V/|V|, then 
    //
    //          V'       V o V'
    //   N' = -----  -  ------- * V.
    //         |V|       |V|^3
    //
    // When a surface has a non-degenerate Jacobian, V = ds X dt
    // and the derivatives of N may be computed from the first
    // and second partials.
    ON_3dVector V = ON_CrossProduct(ds,dt);
    double len = V.Length();
    double len3 = len*len*len;
    if (len < ON_EPSILON)
    {
      ns = ON_3dVector::ZeroVector;
      nt = ON_3dVector::ZeroVector;
      return false;
    }

    ns.x = dss.y*dt.z - dss.z*dt.y + ds.y*dst.z - ds.z*dst.y;
    ns.y = dss.z*dt.x - dss.x*dt.z + ds.z*dst.x - ds.x*dst.z;
    ns.z = dss.x*dt.y - dss.y*dt.x + ds.x*dst.y - ds.y*dst.x;

    nt.x = dst.y*dt.z - dst.z*dt.y + ds.y*dtt.z - ds.z*dtt.y;
    nt.y = dst.z*dt.x - dst.x*dt.z + ds.z*dtt.x - ds.x*dtt.z;
    nt.z = dst.x*dt.y - dst.y*dt.x + ds.x*dtt.y - ds.y*dtt.x;

    ns = ns/len - ((V*ns)/len3)*V;
    nt = nt/len - ((V*nt)/len3)*V;
  }

  return rc;
}